

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

void push_onecapture(MatchState *ms,int i,char *s,char *e)

{
  lua_State *in_RCX;
  size_t in_RDX;
  int in_ESI;
  lua_State *in_RDI;
  ptrdiff_t l;
  undefined8 in_stack_ffffffffffffffd8;
  uint in_stack_fffffffffffffff0;
  
  if (in_ESI < *(int *)&in_RDI->top) {
    if (*(long *)(&in_RDI->openupval + (long)in_ESI * 4) == -1) {
      lj_err_caller(in_RCX,~LJ_ERR_ERRMEM);
    }
    if (*(long *)(&in_RDI->openupval + (long)in_ESI * 4) == -2) {
      lua_pushinteger(in_RCX,-2);
    }
    else {
      lua_pushlstring(in_RDI,(char *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
    }
  }
  else {
    if (in_ESI != 0) {
      lj_err_caller(in_RCX,(ErrMsg)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    }
    lua_pushlstring(in_RDI,(char *)(ulong)in_stack_fffffffffffffff0,in_RDX);
  }
  return;
}

Assistant:

static void push_onecapture(MatchState *ms, int i, const char *s, const char *e)
{
  if (i >= ms->level) {
    if (i == 0)  /* ms->level == 0, too */
      lua_pushlstring(ms->L, s, (size_t)(e - s));  /* add whole match */
    else
      lj_err_caller(ms->L, LJ_ERR_STRCAPI);
  } else {
    ptrdiff_t l = ms->capture[i].len;
    if (l == CAP_UNFINISHED) lj_err_caller(ms->L, LJ_ERR_STRCAPU);
    if (l == CAP_POSITION)
      lua_pushinteger(ms->L, ms->capture[i].init - ms->src_init + 1);
    else
      lua_pushlstring(ms->L, ms->capture[i].init, (size_t)l);
  }
}